

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O3

int hd_anchor_hash(fy_accel *xl,void *key,void *userdata,void *hash)

{
  uint uVar1;
  int iVar2;
  char *input;
  size_t len;
  size_t local_10;
  
  input = fy_token_get_text((fy_token *)key,&local_10);
  if (input == (char *)0x0) {
    iVar2 = -1;
  }
  else {
    uVar1 = XXH32(input,local_10,0x9e3779b1);
    *(uint *)hash = uVar1;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int hd_anchor_hash(struct fy_accel *xl, const void *key, void *userdata, void *hash) {
    struct fy_token *fyt = (void *) key;
    unsigned int *hashp = hash;
    const char *text;
    size_t len;

    text = fy_token_get_text(fyt, &len);
    if (!text)
        return -1;

    *hashp = XXH32(text, len, 2654435761U);
    return 0;
}